

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.cpp
# Opt level: O1

DominatorTreeNode * __thiscall
spvtools::opt::DominatorTree::GetOrInsertNode(DominatorTree *this,BasicBlock *bb)

{
  _Rb_tree_header *p_Var1;
  Instruction *pIVar2;
  _Base_ptr p_Var3;
  _Rb_tree_color _Var4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_> _Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>,_bool>
  pVar8;
  pair<unsigned_int,_spvtools::opt::DominatorTreeNode> local_58;
  
  pIVar2 = (bb->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  _Var4 = _S_red;
  if (pIVar2->has_result_id_ == true) {
    _Var4 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
  }
  p_Var1 = &(this->nodes_)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar7]) {
    bVar7 = p_Var3[1]._M_color < _Var4;
    if (!bVar7) {
      p_Var6 = p_Var3;
    }
  }
  _Var5._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (_Var5._M_node = p_Var6, _Var4 < p_Var6[1]._M_color))
  {
    _Var5._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)_Var5._M_node == p_Var1) {
    pIVar2 = (bb->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    local_58.first = 0;
    if (pIVar2->has_result_id_ == true) {
      local_58.first = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
    }
    local_58.second.parent_ = (DominatorTreeNode *)0x0;
    local_58.second.children_.
    super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.second.children_.
    super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.second.children_.
    super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.second.dfs_num_pre_ = -1;
    local_58.second.dfs_num_post_ = -1;
    local_58.second.bb_ = bb;
    pVar8 = std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>>>
            ::_M_emplace_unique<std::pair<unsigned_int,spvtools::opt::DominatorTreeNode>>
                      ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>>>
                        *)&this->nodes_,&local_58);
    _Var5 = pVar8.first._M_node;
    if (local_58.second.children_.
        super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.second.children_.
                      super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.second.children_.
                            super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.second.children_.
                            super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return (DominatorTreeNode *)&_Var5._M_node[1]._M_parent;
}

Assistant:

DominatorTreeNode* DominatorTree::GetOrInsertNode(BasicBlock* bb) {
  DominatorTreeNode* dtn = nullptr;

  std::map<uint32_t, DominatorTreeNode>::iterator node_iter =
      nodes_.find(bb->id());
  if (node_iter == nodes_.end()) {
    dtn = &nodes_.emplace(std::make_pair(bb->id(), DominatorTreeNode{bb}))
               .first->second;
  } else {
    dtn = &node_iter->second;
  }

  return dtn;
}